

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool CLI::detail::valid_alias_name_string(string *str)

{
  int iVar1;
  size_type sVar2;
  allocator<char> local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&valid_alias_name_string(std::__cxx11::string_const&)::
                                 badChars_abi_cxx11_);
    if (iVar1 != 0) {
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"\n",&local_29);
      ::std::operator+(&valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_,
                       &local_28,'\0');
      ::std::__cxx11::string::~string((string *)&local_28);
      __cxa_atexit(::std::__cxx11::string::~string,
                   &valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&valid_alias_name_string(std::__cxx11::string_const&)::badChars_abi_cxx11_
                         );
    }
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(str,&valid_alias_name_string(std::__cxx11::string_const&)::
                             badChars_abi_cxx11_,0);
  return sVar2 == 0xffffffffffffffff;
}

Assistant:

inline bool valid_alias_name_string(const std::string &str) {
    static const std::string badChars(std::string("\n") + '\0');
    return (str.find_first_of(badChars) == std::string::npos);
}